

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwap.c
# Opt level: O1

uint Kit_TruthSemiCanonicize_Yasha1(word *pInOut,int nVars,char *pCanonPerm,int *pStore)

{
  ushort *puVar1;
  ulong *puVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  
  bVar3 = (byte)nVars;
  uVar6 = 1 << (bVar3 - 6 & 0x1f);
  if (nVars < 7) {
    uVar6 = 1;
  }
  if (nVars < 0x11) {
    iVar5 = Kit_TruthCountOnes_64bit(pInOut,nVars);
    iVar7 = uVar6 * 0x20;
    if (iVar5 == iVar7) {
      uVar9 = 1 << (bVar3 + 2 & 0x1f);
    }
    else {
      uVar9 = 0;
      if (iVar5 != iVar7 && SBORROW4(iVar5,iVar7) == (int)(iVar5 + uVar6 * -0x20) < 0) {
        uVar9 = 1 << (bVar3 & 0x1f);
        if (0 < (int)uVar6) {
          lVar8 = (ulong)uVar6 + 1;
          do {
            pInOut[lVar8 + -2] = ~pInOut[lVar8 + -2];
            lVar8 = lVar8 + -1;
          } while (1 < lVar8);
        }
        iVar5 = uVar6 * 0x40 - iVar5;
      }
    }
    Kit_TruthCountOnesInCofs_64bit(pInOut,nVars,pStore);
    if (0 < nVars) {
      uVar10 = 0;
      do {
        iVar7 = pStore[uVar10];
        if (iVar7 * 2 == iVar5) {
          uVar9 = uVar9 | 2 << (bVar3 & 0x1f);
        }
        else if (iVar7 <= iVar5 - iVar7) {
          uVar9 = uVar9 | 1 << ((uint)uVar10 & 0x1f);
          pStore[uVar10] = iVar5 - iVar7;
          Kit_TruthChangePhase_64bit(pInOut,nVars,(uint)uVar10);
        }
        uVar10 = uVar10 + 1;
      } while ((uint)nVars != uVar10);
    }
    do {
      bVar4 = true;
      if (1 < nVars) {
        uVar10 = 0;
        bVar4 = false;
        do {
          if (pStore[uVar10 + 1] < pStore[uVar10]) {
            puVar1 = (ushort *)(pCanonPerm + uVar10);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar2 = (ulong *)(pStore + uVar10);
            *puVar2 = *puVar2 << 0x20 | *puVar2 >> 0x20;
            uVar6 = 2 << ((byte)uVar10 & 0x1f);
            if ((((uVar9 & uVar6) == 0 ^ (byte)(uVar9 >> ((byte)uVar10 & 0x1f))) & 1) == 0) {
              uVar9 = uVar9 ^ 1 << ((uint)uVar10 & 0x1f) ^ uVar6;
            }
            Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,(uint)uVar10);
            bVar4 = true;
          }
          uVar10 = uVar10 + 1;
        } while (nVars - 1 != uVar10);
        bVar4 = !bVar4;
      }
    } while (!bVar4);
    return uVar9;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckySwap.c"
                ,0xfb,"unsigned int Kit_TruthSemiCanonicize_Yasha1(word *, int, char *, int *)");
}

Assistant:

unsigned  Kit_TruthSemiCanonicize_Yasha1( word* pInOut, int nVars, char * pCanonPerm, int * pStore )
{
    int nWords = Kit_TruthWordNum_64bit( nVars );
    int i, fChange, nOnes;
    int Temp;
    unsigned  uCanonPhase=0;
    assert( nVars <= 16 );
    
    nOnes = Kit_TruthCountOnes_64bit(pInOut, nVars);
    if ( nOnes == nWords * 32 )
        uCanonPhase |= (1 << (nVars+2));
    
    else if ( (nOnes > nWords * 32) )
    {
        uCanonPhase |= (1 << nVars);
        Kit_TruthNot_64bit( pInOut, nVars );
        nOnes = nWords*64 - nOnes;
    }
    
    // collect the minterm counts
    Kit_TruthCountOnesInCofs_64bit( pInOut, nVars, pStore );
    
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if (  2*pStore[i]  == nOnes)
        {
            uCanonPhase |= (1 << (nVars+1));
            continue;
        }
        if ( pStore[i] > nOnes-pStore[i])
            continue;
        uCanonPhase |= (1 << i);
        pStore[i] = nOnes-pStore[i]; 
        Kit_TruthChangePhase_64bit( pInOut, nVars, i );
    }  
    
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[i] <= pStore[i+1] )
                continue;            
            fChange = 1;
            
            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;
            
            Temp = pStore[i];
            pStore[i] = pStore[i+1];
            pStore[i+1] = Temp;
            
            // if the polarity of variables is different, swap them
            if ( ((uCanonPhase & (1 << i)) > 0) != ((uCanonPhase & (1 << (i+1))) > 0) )
            {
                uCanonPhase ^= (1 << i);
                uCanonPhase ^= (1 << (i+1));
            }
            
            Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );            
        }
    } while ( fChange );
    return uCanonPhase;
}